

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_uniform_initializers.cpp
# Opt level: O2

void linker::set_opaque_binding
               (void *mem_ctx,gl_shader_program *prog,ir_variable *var,glsl_type *type,char *name,
               int *binding)

{
  char cVar1;
  int iVar2;
  glsl_type *type_00;
  gl_linked_shader *pgVar3;
  gl_program *pgVar4;
  gl_bindless_image *pgVar5;
  gl_bindless_sampler *pgVar6;
  char *name_00;
  gl_uniform_storage *pgVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint i;
  uint uVar12;
  
  if ((type->field_0x4 == '\x11') && (type_00 = (type->fields).array, type_00->field_0x4 == '\x11'))
  {
    for (uVar12 = 0; uVar12 < type->length; uVar12 = uVar12 + 1) {
      name_00 = ralloc_asprintf(mem_ctx,"%s[%d]",name,(ulong)uVar12);
      set_opaque_binding(mem_ctx,prog,var,type_00,name_00,binding);
    }
  }
  else {
    pgVar7 = get_storage(prog,name);
    if (pgVar7 != (gl_uniform_storage *)0x0) {
      uVar8 = (ulong)(pgVar7->array_elements + (uint)(pgVar7->array_elements == 0));
      for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        iVar2 = *binding;
        *binding = iVar2 + 1;
        pgVar7->storage[uVar9].b = iVar2;
      }
      for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
        pgVar3 = prog->_LinkedShaders[lVar10];
        if ((pgVar3 != (gl_linked_shader *)0x0) && (pgVar7->opaque[lVar10].active == true)) {
          cVar1 = pgVar7->type->field_0x4;
          if (cVar1 == '\f') {
            for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
              uVar11 = pgVar7->opaque[lVar10].index + uVar9;
              if (((var->data).field_0x6 & 4) == 0) {
                if (0x1f < (uint)uVar11) break;
                pgVar3->Program->SamplerUnits[uVar11 & 0xffffffff] =
                     *(GLubyte *)(pgVar7->storage + uVar9);
              }
              else {
                pgVar4 = pgVar3->Program;
                if ((pgVar4->field_20).sh.NumBindlessSamplers <= (uint)uVar11) break;
                pgVar6 = (pgVar4->field_20).sh.BindlessSamplers;
                pgVar6[uVar11 & 0xffffffff].unit = *(GLubyte *)(pgVar7->storage + uVar9);
                pgVar6[uVar11 & 0xffffffff].bound = '\x01';
                (pgVar4->field_20).sh.HasBoundBindlessSampler = '\x01';
              }
            }
          }
          else if (cVar1 == '\r') {
            for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
              uVar11 = pgVar7->opaque[lVar10].index + uVar9;
              if (((var->data).field_0x6 & 4) == 0) {
                if (0x1f < (uint)uVar11) break;
                (pgVar3->Program->field_20).sh.ImageUnits[uVar11 & 0xffffffff] =
                     *(GLubyte *)(pgVar7->storage + uVar9);
              }
              else {
                pgVar4 = pgVar3->Program;
                if ((pgVar4->field_20).sh.NumBindlessImages <= (uint)uVar11) break;
                pgVar5 = (pgVar4->field_20).sh.BindlessImages;
                pgVar5[uVar11 & 0xffffffff].unit = *(GLubyte *)(pgVar7->storage + uVar9);
                pgVar5[uVar11 & 0xffffffff].bound = '\x01';
                (pgVar4->field_20).sh.HasBoundBindlessImage = '\x01';
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
set_opaque_binding(void *mem_ctx, gl_shader_program *prog,
                   const ir_variable *var, const glsl_type *type,
                   const char *name, int *binding)
{

   if (type->is_array() && type->fields.array->is_array()) {
      const glsl_type *const element_type = type->fields.array;

      for (unsigned int i = 0; i < type->length; i++) {
         const char *element_name = ralloc_asprintf(mem_ctx, "%s[%d]", name, i);

         set_opaque_binding(mem_ctx, prog, var, element_type,
                            element_name, binding);
      }
   } else {
      struct gl_uniform_storage *const storage = get_storage(prog, name);

      if (!storage)
         return;

      const unsigned elements = MAX2(storage->array_elements, 1);

      /* Section 4.4.6 (Opaque-Uniform Layout Qualifiers) of the GLSL 4.50 spec
       * says:
       *
       *     "If the binding identifier is used with an array, the first element
       *     of the array takes the specified unit and each subsequent element
       *     takes the next consecutive unit."
       */
      for (unsigned int i = 0; i < elements; i++) {
         storage->storage[i].i = (*binding)++;
      }

      for (int sh = 0; sh < MESA_SHADER_STAGES; sh++) {
         gl_linked_shader *shader = prog->_LinkedShaders[sh];

         if (!shader)
            continue;
         if (!storage->opaque[sh].active)
            continue;

         if (storage->type->is_sampler()) {
            for (unsigned i = 0; i < elements; i++) {
               const unsigned index = storage->opaque[sh].index + i;

               if (var->data.bindless) {
                  if (index >= shader->Program->sh.NumBindlessSamplers)
                     break;
                  shader->Program->sh.BindlessSamplers[index].unit =
                     storage->storage[i].i;
                  shader->Program->sh.BindlessSamplers[index].bound = true;
                  shader->Program->sh.HasBoundBindlessSampler = true;
               } else {
                  if (index >= ARRAY_SIZE(shader->Program->SamplerUnits))
                     break;
                  shader->Program->SamplerUnits[index] =
                     storage->storage[i].i;
               }
            }
         } else if (storage->type->is_image()) {
            for (unsigned i = 0; i < elements; i++) {
               const unsigned index = storage->opaque[sh].index + i;


               if (var->data.bindless) {
                  if (index >= shader->Program->sh.NumBindlessImages)
                     break;
                  shader->Program->sh.BindlessImages[index].unit =
                     storage->storage[i].i;
                  shader->Program->sh.BindlessImages[index].bound = true;
                  shader->Program->sh.HasBoundBindlessImage = true;
               } else {
                  if (index >= ARRAY_SIZE(shader->Program->sh.ImageUnits))
                     break;
                  shader->Program->sh.ImageUnits[index] =
                     storage->storage[i].i;
               }
            }
         }
      }
   }
}